

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

ON_UuidIndexList2 * __thiscall
ON_UuidIndexList2::operator=(ON_UuidIndexList2 *this,ON_UuidIndexList2 *src)

{
  _Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_int>,_std::allocator<std::pair<const_ON_UUID_struct,_int>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<int>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  
  if (this != src) {
    this_00 = (_Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_int>,_std::allocator<std::pair<const_ON_UUID_struct,_int>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<int>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)operator_new(0x38);
    std::
    _Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_int>,_std::allocator<std::pair<const_ON_UUID_struct,_int>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<int>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(this_00,(_Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_int>,_std::allocator<std::pair<const_ON_UUID_struct,_int>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<int>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)(src->m_private)._M_t.
                            super___uniq_ptr_impl<ON_UuidIndexList2_Private,_std::default_delete<ON_UuidIndexList2_Private>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ON_UuidIndexList2_Private_*,_std::default_delete<ON_UuidIndexList2_Private>_>
                            .super__Head_base<0UL,_ON_UuidIndexList2_Private_*,_false>._M_head_impl)
    ;
    std::__uniq_ptr_impl<ON_UuidIndexList2_Private,_std::default_delete<ON_UuidIndexList2_Private>_>
    ::reset((__uniq_ptr_impl<ON_UuidIndexList2_Private,_std::default_delete<ON_UuidIndexList2_Private>_>
             *)this,(pointer)this_00);
  }
  return this;
}

Assistant:

ON_UuidIndexList2& ON_UuidIndexList2::operator=(const ON_UuidIndexList2& src)
{
  if (this != &src)
  {
    m_private.reset(new ON_UuidIndexList2_Private(*src.m_private));
  }
  return *this;
}